

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexicon.cpp
# Opt level: O1

void __thiscall Lexico::AnalisadorLexico(Lexico *this)

{
  bool bVar1;
  int iVar2;
  long *plVar3;
  uint uVar4;
  ulong uVar5;
  uint final;
  int iVar6;
  uint uVar7;
  char ch;
  vector<char,_std::allocator<char>_> caracter;
  string palavra;
  ifstream fin;
  char local_299;
  char *local_298;
  iterator iStack_290;
  char *local_288;
  undefined1 *local_278;
  long local_270;
  undefined1 local_268;
  undefined7 uStack_267;
  string local_258;
  long local_238 [65];
  
  std::ifstream::ifstream
            (local_238,"/media/augusto/Augusto/Documentos/Codigos/simple-parser/test.txt",_S_in);
  local_298 = (char *)0x0;
  iStack_290._M_current = (char *)0x0;
  local_288 = (char *)0x0;
  while (plVar3 = (long *)std::istream::get((char *)local_238),
        (*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) == 0) {
    if (iStack_290._M_current == local_288) {
      std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                ((vector<char,std::allocator<char>> *)&local_298,iStack_290,&local_299);
    }
    else {
      *iStack_290._M_current = local_299;
      iStack_290._M_current = iStack_290._M_current + 1;
    }
  }
  std::ios::clear((int)local_238 + (int)*(undefined8 *)(local_238[0] + -0x18));
  std::ifstream::close();
  local_278 = &local_268;
  local_270 = 0;
  local_268 = 0;
  if (iStack_290._M_current == local_298) {
    final = 0;
  }
  else {
    uVar7 = 1;
    uVar5 = 0;
    iVar6 = 0;
    final = 0;
    do {
      iVar2 = PosicaoIndice(this,local_298[uVar5]);
      uVar4 = uVar7;
      if (iVar2 == -1) {
        uVar4 = 0;
      }
      if (uVar7 == 1) {
        uVar4 = uVar7;
      }
      uVar7 = uVar4;
      if (uVar4 == 1) {
        uVar7 = 0x3c;
      }
      if (iVar2 != -1) {
        uVar7 = this->automato[(int)uVar4][iVar2];
      }
      if (1 < uVar7) {
        final = uVar7;
      }
      if (uVar7 != 0) {
        if (uVar7 == 2) {
          std::__cxx11::string::push_back((char)&local_278);
        }
        iVar6 = iVar6 + 1;
      }
      if (uVar7 == 0) {
        if ((final == 0x2c) || (final == 2)) {
          local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_258,local_278,local_278 + local_270);
          bVar1 = Tokens::IsReservada(&this->super_Tokens,&local_258);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
          }
          if (!bVar1) {
            Tokens::setToken(&this->super_Tokens,2,(int)local_270);
          }
          local_270 = 0;
          *local_278 = 0;
        }
        else {
          Token(this,final);
        }
        final = 0;
        uVar7 = 1;
      }
      else if (uVar7 == 0x3c) {
        std::operator<<((ostream *)&std::cout,"\nExpected caracter valid!!\n\n");
        exit(0);
      }
      uVar5 = (ulong)iVar6;
    } while (uVar5 < (ulong)((long)iStack_290._M_current - (long)local_298));
  }
  Token(this,final);
  Tokens::Inverter(&this->super_Tokens);
  if (local_278 != &local_268) {
    operator_delete(local_278,CONCAT71(uStack_267,local_268) + 1);
  }
  if (local_298 != (char *)0x0) {
    operator_delete(local_298,(long)local_288 - (long)local_298);
  }
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void Lexico::AnalisadorLexico() {
  ifstream fin ("/media/augusto/Augusto/Documentos/Codigos/simple-parser/test.txt", ifstream::in);
  vector<char> caracter;
  char ch;
  int i, j;

  while (fin.get(ch)) {
    caracter.push_back(ch);
  }

  fin.clear();
  fin.close();
  int current_state = 1;
  int final_state = 0;
  int indice_caracter;
  string palavra;
  i = j = 0;
  while (i < caracter.size()) {
    indice_caracter = PosicaoIndice(caracter[i]);
    // cout << " " << caracter[i] << " | " << current_state << " -> " << indice_caracter << "\n";
    if (indice_caracter == -1 && current_state != 1) current_state = 0;
    if (indice_caracter == -1 && current_state == 1) current_state = estado_erro;
    if (indice_caracter != -1) current_state = automato[current_state][indice_caracter];

    if (isFinal(current_state)) final_state = current_state;

        // cout << caracter[i];
    if (current_state != 0) {
      if (current_state == 2 ) {
       palavra.push_back(caracter[i]);
      }
      i++;
    }
    if (current_state == estado_erro) {
      cout << "\nExpected caracter valid!!\n\n";
      exit(0);
    }
    if (current_state == 0) {
      if (final_state == 2 || final_state == UNDER) {
        // cout << "palavra: " << palavra << "\n";
        if (Tokens::IsReservada(palavra));
        else Tokens::setToken(2, palavra.size());
        palavra.clear();
      }
      else Token(final_state);
      current_state = 1;
      final_state = 0;
    }
  }
  Token (final_state);
  Inverter();
}